

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group.cpp
# Opt level: O1

void __thiscall r_exec::Group::cov(Group *this)

{
  _Rb_tree_header *p_Var1;
  char cVar2;
  byte bVar3;
  _Mem *this_00;
  _Base_ptr p_Var4;
  const_iterator v;
  _Hash_node_base *p_Var5;
  
  p_Var5 = (this->viewing_groups)._M_h._M_before_begin._M_nxt;
  if (p_Var5 != (_Hash_node_base *)0x0) {
    p_Var1 = &(this->newly_salient_views)._M_t._M_impl.super__Rb_tree_header;
    do {
      p_Var4 = (this->newly_salient_views)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      if (((_Rb_tree_header *)p_Var4 != p_Var1 & *(byte *)&p_Var5[2]._M_nxt) == 1) {
        do {
          cVar2 = (**(code **)(**(long **)(p_Var4 + 1) + 0x10))();
          if (cVar2 == '\0') {
            (**(code **)(**(long **)(*(long *)(p_Var4 + 1) + 0x20) + 0x20))
                      (*(long **)(*(long *)(p_Var4 + 1) + 0x20),0);
            bVar3 = r_code::Atom::getDescriptor();
            if ((bVar3 & 0xf8) != 200) {
              this_00 = (_Mem *)r_code::Mem::Get();
              _Mem::inject_copy(this_00,*(View **)(p_Var4 + 1),(Group *)p_Var5[1]._M_nxt);
            }
          }
          p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
        } while ((_Rb_tree_header *)p_Var4 != p_Var1);
      }
      p_Var5 = p_Var5->_M_nxt;
    } while (p_Var5 != (_Hash_node_base *)0x0);
  }
  return;
}

Assistant:

void Group::cov()
{
    // cov, i.e. injecting now newly salient views in the viewing groups from which the group is visible and has cov.
    // reduction jobs will be added at each of the eligible viewing groups' own update time.
    std::unordered_map<Group *, bool>::const_iterator vg;

    for (vg = viewing_groups.begin(); vg != viewing_groups.end(); ++vg) {
        if (vg->second) { // cov==true.
            std::multiset<P<View>, r_code::View::Less>::const_iterator v;

            for (v = newly_salient_views.begin(); v != newly_salient_views.end(); ++v) { // no cov for pgm (all sorts), groups, notifications.
                if ((*v)->isNotification()) {
                    continue;
                }

                switch ((*v)->object->code(0).getDescriptor()) {
                case Atom::GROUP:
                case Atom::NULL_PROGRAM:
                case Atom::INSTANTIATED_PROGRAM:
                case Atom::INSTANTIATED_CPP_PROGRAM:
                case Atom::INSTANTIATED_INPUT_LESS_PROGRAM:
                case Atom::INSTANTIATED_ANTI_PROGRAM:
                case Atom::COMPOSITE_STATE:
                case Atom::MODEL:
                    break;

                default:
                    _Mem::Get()->inject_copy(*v, vg->first); // no need to protect group->newly_salient_views[i] since the support values for the ctrl values are not even read.
                    break;
                }
            }
        }
    }
}